

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleRpc(ChainImpl *this,CRPCCommand *command)

{
  _func_int **pp_Var1;
  CRPCCommand *in_RDX;
  long in_FS_OFFSET;
  _Any_data __tmp;
  _Any_data local_58;
  _func_int *local_48;
  _func_int *p_Stack_40;
  _func_int **local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var1 = (_func_int **)operator_new(0x90);
  *pp_Var1 = (_func_int *)&PTR__RpcHandlerImpl_00a23678;
  CRPCCommand::CRPCCommand((CRPCCommand *)(pp_Var1 + 1),in_RDX);
  pp_Var1[0x11] = (_func_int *)in_RDX;
  uStack_30 = 0;
  local_58._M_unused._M_object = pp_Var1[9];
  local_58._8_8_ = pp_Var1[10];
  pp_Var1[9] = (_func_int *)pp_Var1;
  pp_Var1[10] = (_func_int *)0x0;
  local_48 = pp_Var1[0xb];
  p_Stack_40 = pp_Var1[0xc];
  pp_Var1[0xb] = std::
                 _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:503:27)>
                 ::_M_manager;
  pp_Var1[0xc] = std::
                 _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:503:27)>
                 ::_M_invoke;
  local_38 = pp_Var1;
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  CRPCTable::appendCommand(&tableRPC,(string *)(pp_Var1 + 5),(CRPCCommand *)(pp_Var1 + 1));
  (this->super_Chain)._vptr_Chain = pp_Var1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleRpc(const CRPCCommand& command) override
    {
        return std::make_unique<RpcHandlerImpl>(command);
    }